

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O3

LispPTR get_ivar_name(frameex1 *fx_addr68k,DLword offset,int *localivar)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar7 = (ulong)fx_addr68k->fnheader;
  if ((fx_addr68k->fnheader & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar7);
  }
  uVar4 = (ulong)Lisp_world[uVar7 + 7];
  if (uVar4 == 0) {
    pLVar2 = (LispPTR *)(Lisp_world + uVar7 + 0xc);
    pLVar3 = (LispPTR *)
             (Lisp_world + uVar7 + (long)((int)(Lisp_world[uVar7 + 2] - 0x18) >> 3) * 2 + 0xc);
  }
  else {
    uVar5 = (uint)Lisp_world[uVar7 + 7];
    pLVar2 = (LispPTR *)(Lisp_world + uVar7 + 8);
    do {
      if (*(uint *)((long)pLVar2 + uVar4 * 2) == (uint)offset) {
        iVar6 = 0;
        if (*pLVar2 != 0) goto LAB_00114de8;
        break;
      }
      pLVar2 = pLVar2 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    pLVar2 = (LispPTR *)((long)(Lisp_world + uVar7 + 8) + uVar4 * 4);
    pLVar3 = pLVar2 + ((long)((long)Lisp_world +
                             (((ulong)(Lisp_world[uVar7 + 2] & 0xfffffffe) + uVar7 * 2) -
                             (long)pLVar2)) >> 3);
  }
  iVar6 = 1;
  LVar1 = *pLVar3;
  while (LVar1 != offset) {
    pLVar3 = pLVar3 + 1;
    pLVar2 = pLVar2 + 1;
    LVar1 = *pLVar3;
  }
LAB_00114de8:
  *localivar = iVar6;
  return *pLVar2;
}

Assistant:

LispPTR get_ivar_name(struct frameex1 *fx_addr68k, DLword offset, int *localivar) {
  NAMETABLE *first_table;
  NAMETABLE *second_table;
  struct fnhead *fnobj;
  int i;
#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr((fx_addr68k)->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)(fx_addr68k)->hi2fnheader << 16) |
                                              (fx_addr68k)->lofnheader);
#endif /* BIGVM */
  if (fnobj->ntsize > 0) {
    /* name table exists */
    first_table = (NAMETABLE *)(fnobj + 1);
    second_table = (NAMETABLE *)((DLword *)first_table + fnobj->ntsize);

    for (i = 0; (i < fnobj->ntsize) && (GetNTEntry(second_table) != offset);
         first_table++, second_table++, i++)
      ;
    if ((i < fnobj->ntsize) && (GetNTEntry(first_table) != 0)) {
      /* target ivar was in name table */
      *localivar = 0;
      return ((LispPTR)(GetNTEntry(first_table)));
    } else {
/* Target ivar is in locar vars table */
#ifdef BIGATOMS
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize);
      second_table =
          first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - (DLword *)first_table) >> 2);
#else
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize << 1);
      second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
    }
  } else {
/* name table doesn't exist, so all ivars are in locar vars table */
#ifdef BIGATOMS
    int delta;
    first_table = (NAMETABLE *)(fnobj + 1) + (4 >> 1);
    delta = (DLword *)(((DLword *)fnobj) + (fnobj->startpc >> 1)) - (DLword *)first_table;
    second_table = first_table + (delta >> 2);
#else
    first_table = (NAMETABLE *)(fnobj + 1) + 4;
    second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
  }
#ifdef BIGATOMS
  while (*(second_table) != (VTY_IVAR | offset))
#else
  while (GETWORD(second_table) != (VTY_IVAR | offset))
#endif /* BIGATOMS */

  {
    first_table++;
    second_table++;
  }
  *localivar = 1;

#ifdef BIGATOMS
  return ((LispPTR)(*(first_table)));
#else
  return ((LispPTR)(GETWORD(first_table)));
#endif /* BIGATOMS */

}